

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilDouble.h
# Opt level: O2

xdbl Xdbl_Mul(xdbl a,xdbl b)

{
  bool bVar1;
  xdbl xVar2;
  ulong uVar3;
  ulong uVar4;
  word Exp;
  
  xVar2 = b;
  if (a < b) {
    xVar2 = a;
  }
  if (b < a) {
    b = a;
  }
  uVar4 = b >> 0x20 & 0xffff;
  uVar3 = xVar2 >> 0x20 & 0xffff;
  uVar3 = (uVar4 * (xVar2 & 0xffffffff) >> 0xf) + (uVar3 * (b & 0xffffffff) >> 0xf) +
          ((b & 0xffffffff) * (xVar2 & 0xffffffff) >> 0x2f | uVar4 * uVar3 * 0x20000);
  bVar1 = uVar3 >> 0x30 != 0;
  Exp = (xVar2 >> 0x30) + (b >> 0x30) + (ulong)bVar1;
  if (Exp < 0x10000) {
    xVar2 = Xdbl_Create(Exp,uVar3 >> bVar1);
    return xVar2;
  }
  return 0xffffffffffffffff;
}

Assistant:

static inline xdbl Xdbl_Mul( xdbl a, xdbl b )
{
    word Exp, Mnt, MntA, MntB, MntAh, MntBh, MntAl, MntBl;
    if ( a < b ) a ^= b, b ^= a, a ^= b;
    assert( a >= b );
    MntA  = Xdbl_Mnt(a);
    MntB  = Xdbl_Mnt(b);
    MntAh = MntA>>32;
    MntBh = MntB>>32;
    MntAl = (MntA<<32)>>32;
    MntBl = (MntB<<32)>>32;
    Mnt = ((MntAh * MntBh) << 17) + ((MntAl * MntBl) >> 47) + ((MntAl * MntBh) >> 15) + ((MntAh * MntBl) >> 15);
    Exp = Xdbl_Exp(a) + Xdbl_Exp(b);
    if ( Mnt >> 48 ) // new MSB is created
        Exp++, Mnt >>= 1;
    if ( Exp >> 16 ) // overflow
        return Xdbl_Maximum();
    return Xdbl_Create( Exp, Mnt );
}